

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# grammar.cpp
# Opt level: O1

bool __thiscall grammar::has_empty_production(grammar *this,token_t nonterminal)

{
  pointer psVar1;
  bool bVar2;
  mapped_type *pmVar3;
  strong_t<int,_grammar::token_tag> *sym;
  pointer psVar4;
  bool bVar5;
  bool bVar6;
  key_type local_4;
  
  if (nonterminal.internal_rep < 1) {
    bVar6 = false;
  }
  else {
    pmVar3 = std::
             map<strong_t<int,_grammar::token_tag>,_std::vector<strong_t<int,_grammar::token_tag>,_std::allocator<strong_t<int,_grammar::token_tag>_>_>,_std::less<strong_t<int,_grammar::token_tag>_>,_std::allocator<std::pair<const_strong_t<int,_grammar::token_tag>,_std::vector<strong_t<int,_grammar::token_tag>,_std::allocator<strong_t<int,_grammar::token_tag>_>_>_>_>_>
             ::at(&this->rules,&local_4);
    psVar4 = (pmVar3->
             super__Vector_base<strong_t<int,_grammar::token_tag>,_std::allocator<strong_t<int,_grammar::token_tag>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    psVar1 = (pmVar3->
             super__Vector_base<strong_t<int,_grammar::token_tag>,_std::allocator<strong_t<int,_grammar::token_tag>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    bVar6 = psVar4 != psVar1;
    if (psVar4 == psVar1) {
      bVar6 = true;
    }
    else {
      bVar5 = true;
      do {
        if ((psVar4->internal_rep == 0) && (bVar5)) {
          bVar2 = false;
        }
        else {
          bVar5 = psVar4->internal_rep == 0;
          bVar2 = true;
        }
        if (!bVar2) break;
        psVar4 = psVar4 + 1;
        bVar6 = psVar4 != psVar1;
      } while (bVar6);
      bVar6 = (bool)(bVar6 | bVar5);
    }
  }
  return bVar6;
}

Assistant:

bool grammar::has_empty_production(token_t nonterminal) const {
    if (nonterminal <= 0) return false;

    const auto & rule_list = rules.at(nonterminal);

    // An initial separator = empty production
    bool last_was_sep = true;
    for (const auto & sym : rule_list) {
        if (sym == rule_sep and last_was_sep)
            return true;  // Pipes surrounding nothing = empty production
        else
            last_was_sep = sym == rule_sep;
    }

    // Separator at the end = empty production
    return last_was_sep;
}